

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::PrefixIncDec(SQCompiler *this,SQInteger token)

{
  long p3;
  long lVar1;
  SQInteger SVar2;
  SQFuncState *this_00;
  byte bVar3;
  byte bVar4;
  SQExpState es;
  SQInstruction local_50;
  SQInteger local_48;
  SQInteger SStack_40;
  undefined8 local_38;
  
  SVar2 = SQLexer::Lex(&this->_lex);
  this->_token = SVar2;
  local_48 = (this->_es).etype;
  SStack_40 = (this->_es).epos;
  local_38 = *(undefined8 *)&(this->_es).donot_get;
  (this->_es).donot_get = true;
  PrefixedExpr(this);
  lVar1 = (this->_es).etype;
  if (4 < lVar1 - 1U) goto LAB_0014c92c;
  p3 = (ulong)(token != 0x130) * 2 + -1;
  bVar3 = (byte)p3;
  switch(lVar1) {
  case 1:
    Error(this,"can\'t \'++\' or \'--\' an expression");
    goto LAB_0014c92c;
  default:
    Emit2ArgsOP(this,_OP_INC,p3);
    goto LAB_0014c92c;
  case 4:
    SVar2 = SQFuncState::TopTarget(this->_fs);
    this_00 = this->_fs;
    local_50.op = '%';
    local_50._arg0 = (uchar)SVar2;
    local_50._arg1 = (SQInt32)SVar2;
    local_50._6_2_ = (ushort)bVar3 << 8;
    break;
  case 5:
    SVar2 = SQFuncState::PushTarget(this->_fs,-1);
    local_50._arg1 = (SQInt32)(this->_es).epos;
    local_50.op = ' ';
    bVar4 = (byte)SVar2;
    local_50._arg2 = '\0';
    local_50._arg3 = '\0';
    local_50._arg0 = bVar4;
    SQFuncState::AddInstruction(this->_fs,&local_50);
    local_50.op = '%';
    local_50._arg1 = (SQInt32)SVar2;
    local_50._6_2_ = (ushort)bVar3 << 8;
    local_50._arg0 = bVar4;
    SQFuncState::AddInstruction(this->_fs,&local_50);
    this_00 = this->_fs;
    local_50._arg1 = (SQInt32)(this->_es).epos;
    local_50.op = '\x1f';
    local_50._arg3 = '\0';
    local_50._arg2 = bVar4;
    local_50._arg0 = bVar4;
  }
  SQFuncState::AddInstruction(this_00,&local_50);
LAB_0014c92c:
  *(undefined8 *)&(this->_es).donot_get = local_38;
  (this->_es).etype = local_48;
  (this->_es).epos = SStack_40;
  return;
}

Assistant:

void PrefixIncDec(SQInteger token)
    {
        SQExpState  es;
        SQInteger diff = (token==TK_MINUSMINUS) ? -1 : 1;
        Lex();
        es = _es;
        _es.donot_get = true;
        PrefixedExpr();
        if(_es.etype==EXPR) {
            Error(_SC("can't '++' or '--' an expression"));
        }
        else if(_es.etype==OBJECT || _es.etype==BASE) {
            Emit2ArgsOP(_OP_INC, diff);
        }
        else if(_es.etype==LOCAL) {
            SQInteger src = _fs->TopTarget();
            _fs->AddInstruction(_OP_INCL, src, src, 0, diff);

        }
        else if(_es.etype==OUTER) {
            SQInteger tmp = _fs->PushTarget();
            _fs->AddInstruction(_OP_GETOUTER, tmp, _es.epos);
            _fs->AddInstruction(_OP_INCL,     tmp, tmp, 0, diff);
            _fs->AddInstruction(_OP_SETOUTER, tmp, _es.epos, tmp);
        }
        _es = es;
    }